

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmFunctionCall(ExpressionContext *ctx,VmModule *module,ExprFunctionCall *node)

{
  VmValue *allocator;
  SynBase *allocator_00;
  SynBase *source;
  long lVar1;
  bool bVar2;
  VmConstant *this;
  VmInstruction *this_00;
  VmInstruction *pVVar3;
  VmValue **ppVVar4;
  VmType VVar5;
  uint uniqueId;
  undefined4 in_stack_ffffffffffffff1c;
  VmInstruction *local_a8;
  VmValue *argument;
  ExprBase *value_1;
  ExprBase *value;
  uint argCount;
  VmInstruction *target;
  VmFunction *functionId;
  VmValue *functionContext;
  VmInstruction *inst;
  VmConstant *local_48;
  VmConstant *reference;
  VmConstant *spill;
  VmValue *resultTarget;
  VmValue *function;
  ExprFunctionCall *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  function = (VmValue *)node;
  node_local = (ExprFunctionCall *)module;
  module_local = (VmModule *)ctx;
  resultTarget = CompileVm(ctx,module,node->function);
  if (node_local->function == (ExprBase *)0x0) {
    __assert_fail("module->currentBlock",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xe7d,
                  "VmValue *CompileVmFunctionCall(ExpressionContext &, VmModule *, ExprFunctionCall *)"
                 );
  }
  spill = (VmConstant *)0x0;
  if (((function->type).structType)->size < 0x41) {
    spill = CreateConstantInt((Allocator *)module_local[6].loadStoreInfo.little[0xf].loadPointer,
                              *(SynBase **)&function->type,0);
  }
  else {
    reference = anon_unknown.dwarf_c91b1::CreateAlloca
                          ((ExpressionContext *)module_local,(VmModule *)node_local,
                           *(SynBase **)&function->type,(function->type).structType,"spill",true);
    this = VmModule::get<VmConstant>((VmModule *)node_local);
    allocator = module_local[6].loadStoreInfo.little[0xf].loadPointer;
    VVar5 = GetVmType((ExpressionContext *)module_local,(function->type).structType);
    VmConstant::VmConstant(this,(Allocator *)allocator,VVar5,*(SynBase **)&function->type);
    this->iValue = reference->iValue;
    this->container = reference->container;
    this->isReference = true;
    local_48 = this;
    SmallArray<VmConstant_*,_8U>::push_back(&this->container->users,&local_48);
    spill = local_48;
  }
  this_00 = VmModule::get<VmInstruction>((VmModule *)node_local);
  allocator_00 = node_local[0x4d].super_ExprBase.source;
  VVar5 = GetVmType((ExpressionContext *)module_local,(function->type).structType);
  source = *(SynBase **)&function->type;
  lVar1 = *(long *)&(node_local->super_ExprBase).listed;
  uniqueId = *(uint *)(lVar1 + 0xcc);
  *(uint *)(lVar1 + 0xcc) = uniqueId + 1;
  VmInstruction::VmInstruction(this_00,(Allocator *)allocator_00,VVar5,source,VM_INST_CALL,uniqueId)
  ;
  functionId = (VmFunction *)0x0;
  target = (VmInstruction *)0x0;
  pVVar3 = getType<VmInstruction>(resultTarget);
  if (((pVVar3 != (VmInstruction *)0x0) && (pVVar3->cmd == VM_INST_CONSTRUCT)) &&
     ((pVVar3->super_VmValue).type.type == VM_TYPE_FUNCTION_REF)) {
    ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&pVVar3->arguments,0);
    functionId = (VmFunction *)*ppVVar4;
    ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&pVVar3->arguments,1);
    target = (VmInstruction *)getType<VmFunction>(*ppVVar4);
  }
  value._4_4_ = 2;
  if ((functionId != (VmFunction *)0x0) && (target != (VmInstruction *)0x0)) {
    value._4_4_ = 3;
  }
  for (value_1 = *(ExprBase **)&function->hasSideEffects; value_1 != (ExprBase *)0x0;
      value_1 = value_1->next) {
    value._4_4_ = value._4_4_ + 1;
  }
  SmallArray<VmValue_*,_4U>::reserve(&this_00->arguments,value._4_4_);
  if ((functionId == (VmFunction *)0x0) || (target == (VmInstruction *)0x0)) {
    VmInstruction::AddArgument(this_00,resultTarget);
  }
  else {
    VmInstruction::AddArgument(this_00,&functionId->super_VmValue);
    VmInstruction::AddArgument(this_00,&target->super_VmValue);
  }
  VmInstruction::AddArgument(this_00,&spill->super_VmValue);
  argument = *(VmValue **)&function->hasSideEffects;
  while( true ) {
    if (argument == (VmValue *)0x0) {
      bVar2 = anon_unknown.dwarf_c91b1::HasSideEffects(this_00->cmd);
      (this_00->super_VmValue).hasSideEffects = bVar2;
      bVar2 = anon_unknown.dwarf_c91b1::HasMemoryAccess(this_00->cmd);
      (this_00->super_VmValue).hasMemoryAccess = bVar2;
      VmBlock::AddInstruction((VmBlock *)node_local->function,this_00);
      if (((function->type).structType)->size < 0x41) {
        ctx_local = (ExpressionContext *)
                    anon_unknown.dwarf_c91b1::CheckType
                              ((ExpressionContext *)module_local,(ExprBase *)function,
                               &this_00->super_VmValue);
      }
      else {
        ctx_local = (ExpressionContext *)
                    anon_unknown.dwarf_c91b1::CheckType
                              ((ExpressionContext *)module_local,(ExprBase *)function,
                               &spill->super_VmValue);
      }
      return (VmValue *)ctx_local;
    }
    local_a8 = (VmInstruction *)
               CompileVm((ExpressionContext *)module_local,(VmModule *)node_local,
                         (ExprBase *)argument);
    bVar2 = VmType::operator!=(&(local_a8->super_VmValue).type,&VmType::Void);
    if (!bVar2) break;
    if ((argument->type).structType ==
        *(TypeBase **)&module_local[6].loadStoreInfo.little[0xe].accessSize) {
      VVar5.structType = (TypeBase *)0x11;
      VVar5._0_8_ = VmType::Int.structType;
      local_a8 = anon_unknown.dwarf_c91b1::CreateInstruction
                           ((anon_unknown_dwarf_c91b1 *)node_local,*(VmModule **)&function->type,
                            (SynBase *)VmType::Int._0_8_,VVar5,(VmInstructionType)local_a8,
                            (VmValue *)CONCAT44(in_stack_ffffffffffffff1c,uniqueId));
    }
    VmInstruction::AddArgument(this_00,&local_a8->super_VmValue);
    argument = (VmValue *)argument->source;
  }
  __assert_fail("argument->type != VmType::Void",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xebd,
                "VmValue *CompileVmFunctionCall(ExpressionContext &, VmModule *, ExprFunctionCall *)"
               );
}

Assistant:

VmValue* CompileVmFunctionCall(ExpressionContext &ctx, VmModule *module, ExprFunctionCall *node)
{
	VmValue *function = CompileVm(ctx, module, node->function);

	assert(module->currentBlock);

	VmValue *resultTarget = NULL;

	if(node->type->size > spillTypeSize)
	{
		VmConstant *spill = CreateAlloca(ctx, module, node->source, node->type, "spill", true);

		VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, GetVmType(ctx, node->type), node->source);

		reference->iValue = spill->iValue;
		reference->container = spill->container;
		reference->isReference = true;

		reference->container->users.push_back(reference);

		resultTarget = reference;
	}
	else
	{
		resultTarget = CreateConstantInt(ctx.allocator, node->source, 0);
	}

	VmInstruction *inst = new (module->get<VmInstruction>()) VmInstruction(module->allocator, GetVmType(ctx, node->type), node->source, VM_INST_CALL, module->currentFunction->nextInstructionId++);

	// Inline call target for instruction without context
	VmValue *functionContext = NULL;
	VmFunction *functionId = NULL;

	if(VmInstruction *target = getType<VmInstruction>(function))
	{
		if(target->cmd == VM_INST_CONSTRUCT && target->type.type == VM_TYPE_FUNCTION_REF)
		{
			functionContext = target->arguments[0];
			functionId = getType<VmFunction>(target->arguments[1]);
		}
	}

	unsigned argCount = 2;

	if(functionContext && functionId)
		argCount++;

	for(ExprBase *value = node->arguments.head; value; value = value->next)
		argCount++;

	inst->arguments.reserve(argCount);

	if(functionContext && functionId)
	{
		inst->AddArgument(functionContext);
		inst->AddArgument(functionId);
	}
	else
	{
		inst->AddArgument(function);
	}

	inst->AddArgument(resultTarget);

	for(ExprBase *value = node->arguments.head; value; value = value->next)
	{
		VmValue *argument = CompileVm(ctx, module, value);

		assert(argument->type != VmType::Void);

		if(value->type == ctx.typeFloat)
			argument = CreateInstruction(module, node->source, VmType::Int, VM_INST_DOUBLE_TO_FLOAT, argument);

		inst->AddArgument(argument);
	}

	inst->hasSideEffects = HasSideEffects(inst->cmd);
	inst->hasMemoryAccess = HasMemoryAccess(inst->cmd);

	module->currentBlock->AddInstruction(inst);

	if(node->type->size > spillTypeSize)
		return CheckType(ctx, node, resultTarget);

	return CheckType(ctx, node, inst);
}